

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void __thiscall OpenMD::Stats::collectStats(Stats *this)

{
  double dVar1;
  bool bVar2;
  SnapshotManager *this_00;
  ulong uVar3;
  size_t sVar4;
  Thermo *pTVar5;
  double *pdVar6;
  ElementType *pEVar7;
  size_type sVar8;
  reference pvVar9;
  reference ppBVar10;
  Vector<double,_3U> *pVVar11;
  long in_RDI;
  uint j;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> Jc;
  uint k;
  uint i;
  Thermo thermo;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffff6a8;
  Snapshot *in_stack_fffffffffffff6b0;
  Snapshot *in_stack_fffffffffffff6b8;
  value_type in_stack_fffffffffffff6c0;
  Thermo *in_stack_fffffffffffff6d0;
  long *local_928;
  Thermo *in_stack_fffffffffffff6f0;
  long *local_908;
  ElementType *in_stack_fffffffffffff718;
  MatrixAccumulator *in_stack_fffffffffffff720;
  long *local_8d0;
  BaseAccumulator *in_stack_fffffffffffff738;
  PotVecAccumulator *in_stack_fffffffffffff740;
  PotVecAccumulator *local_8b8;
  Thermo *in_stack_fffffffffffff758;
  Thermo *in_stack_fffffffffffff760;
  BaseAccumulator *in_stack_fffffffffffff768;
  BaseAccumulator *in_stack_fffffffffffff780;
  long *local_858;
  long *local_840;
  long *local_828;
  long *local_810;
  long *local_7f8;
  long *local_7e0;
  long *local_7c8;
  long *local_7b0;
  long *local_798;
  long *local_780;
  BaseAccumulator *in_stack_fffffffffffff888;
  long *local_768;
  Thermo *in_stack_fffffffffffff8a8;
  Thermo *local_750;
  long *local_738;
  BaseAccumulator *in_stack_fffffffffffff8d0;
  long *local_720;
  BaseAccumulator *in_stack_fffffffffffff8e8;
  long *local_708;
  long *local_6e8;
  long *local_6c8;
  long *local_6b0;
  long *local_698;
  long *local_680;
  long *local_668;
  long *local_650;
  long *local_638;
  long *local_620;
  Thermo *in_stack_fffffffffffff9f8;
  long *local_578;
  long *local_560;
  long *local_548;
  long *local_530;
  Thermo *in_stack_fffffffffffffae8;
  long *local_500;
  long *local_4e8;
  long *local_4d0;
  BaseAccumulator *in_stack_fffffffffffffb38;
  uint local_49c;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_498;
  uint local_47c;
  RealType local_478;
  RealType local_470 [17];
  RealType local_3e8;
  RealType local_3e0;
  RealType local_3d8;
  RealType local_3d0;
  RealType local_3c8;
  RealType local_3c0;
  RealType local_3b8;
  RealType local_3b0;
  RealType local_3a8;
  RealType local_3a0;
  RealType local_398;
  RealType local_390;
  Vector<double,_7U> local_388;
  Vector<double,_7U> local_350;
  Vector<double,_7U> local_318;
  Vector<double,_7U> local_2e0;
  Vector<double,_7U> local_2a8;
  double local_270;
  Vector<double,_7U> local_268;
  Vector<double,_7U> local_230;
  double local_1f8;
  Vector<double,_7U> local_1f0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  RealType local_198;
  RealType local_190 [36];
  RealType local_70;
  RealType local_68;
  RealType local_60;
  RealType local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  reference local_30;
  uint local_1c;
  Thermo local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  Thermo::Thermo(&local_18,*(SimInfo **)(in_RDI + 8));
  local_8b8 = in_stack_fffffffffffff740;
  local_750 = in_stack_fffffffffffff8a8;
  for (local_1c = 0; uVar3 = (ulong)local_1c,
      sVar4 = std::bitset<46UL>::size((bitset<46UL> *)(in_RDI + 0x30)), uVar3 < sVar4;
      local_1c = local_1c + 1) {
    std::bitset<46UL>::operator[]
              ((bitset<46UL> *)in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffff6b0);
    std::bitset<46UL>::reference::~reference(&local_30);
    if (bVar2) {
      switch(local_1c) {
      case 0:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffffb38 = pvVar9->accumulator;
        if (in_stack_fffffffffffffb38 == (BaseAccumulator *)0x0) {
          local_4d0 = (long *)0x0;
        }
        else {
          local_4d0 = (long *)__dynamic_cast(in_stack_fffffffffffffb38,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_38 = Snapshot::getTime(local_10);
        (**(code **)(*local_4d0 + 0x20))(local_4d0,&local_38);
        break;
      case 1:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          pTVar5 = (Thermo *)0x0;
        }
        else {
          pTVar5 = (Thermo *)
                   __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                  &Accumulator::typeinfo,0);
        }
        in_stack_fffffffffffffae8 = pTVar5;
        local_50 = Thermo::getTotalEnergy((Thermo *)in_stack_fffffffffffff6c0);
        (*(code *)(pTVar5->info_->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)(pTVar5,&local_50);
        break;
      case 2:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_500 = (long *)0x0;
        }
        else {
          local_500 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_48 = Thermo::getPotential((Thermo *)in_stack_fffffffffffff6b0);
        (**(code **)(*local_500 + 0x20))(local_500,&local_48);
        break;
      case 3:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_4e8 = (long *)0x0;
        }
        else {
          local_4e8 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_40 = Thermo::getKinetic(in_stack_fffffffffffff6d0);
        (**(code **)(*local_4e8 + 0x20))(local_4e8,&local_40);
        break;
      case 4:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_530 = (long *)0x0;
        }
        else {
          local_530 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_58 = Thermo::getTemperature(in_stack_fffffffffffff6d0);
        (**(code **)(*local_530 + 0x20))(local_530,&local_58);
        break;
      case 5:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_548 = (long *)0x0;
        }
        else {
          local_548 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_60 = Thermo::getPressure((Thermo *)in_stack_fffffffffffff780);
        (**(code **)(*local_548 + 0x20))(local_548,&local_60);
        break;
      case 6:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_560 = (long *)0x0;
        }
        else {
          local_560 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_68 = Thermo::getVolume((Thermo *)in_stack_fffffffffffff6b0);
        (**(code **)(*local_560 + 0x20))(local_560,&local_68);
        break;
      case 7:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_620 = (long *)0x0;
        }
        else {
          local_620 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_190[0] = Thermo::getHullVolume(&local_18);
        (**(code **)(*local_620 + 0x20))(local_620,local_190);
        break;
      case 8:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_638 = (long *)0x0;
        }
        else {
          local_638 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_198 = Thermo::getGyrationalVolume(in_stack_fffffffffffff760);
        (**(code **)(*local_638 + 0x20))(local_638,&local_198);
        break;
      case 9:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_578 = (long *)0x0;
        }
        else {
          local_578 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_70 = Snapshot::getConservedQuantity(local_10);
        (**(code **)(*local_578 + 0x20))(local_578,&local_70);
        break;
      case 10:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_650 = (long *)0x0;
        }
        else {
          local_650 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_1a0 = Thermo::getTranslationalKinetic((Thermo *)local_8b8);
        (**(code **)(*local_650 + 0x20))(local_650,&local_1a0);
        break;
      case 0xb:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_668 = (long *)0x0;
        }
        else {
          local_668 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_1a8 = Thermo::getRotationalKinetic((Thermo *)in_stack_fffffffffffff8d0);
        (**(code **)(*local_668 + 0x20))(local_668,&local_1a8);
        break;
      case 0xc:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_680 = (long *)0x0;
        }
        else {
          local_680 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_1b0 = Thermo::getElectronicKinetic(in_stack_fffffffffffff6f0);
        (**(code **)(*local_680 + 0x20))(local_680,&local_1b0);
        break;
      case 0xd:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_698 = (long *)0x0;
        }
        else {
          local_698 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_1b8 = Snapshot::getLongRangePotential(in_stack_fffffffffffff6b0);
        (**(code **)(*local_698 + 0x20))(local_698,&local_1b8);
        break;
      case 0xe:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_6b0 = (long *)0x0;
        }
        else {
          local_6b0 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getLongRangePotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_1f0,1);
        (**(code **)(*local_6b0 + 0x20))(local_6b0,pdVar6);
        break;
      case 0xf:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_6c8 = (long *)0x0;
        }
        else {
          local_6c8 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getLongRangePotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_230,2);
        dVar1 = *pdVar6;
        Snapshot::getSelfPotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_268,2);
        local_1f8 = dVar1 + *pdVar6;
        (**(code **)(*local_6c8 + 0x20))(local_6c8,&local_1f8);
        break;
      case 0x10:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_6e8 = (long *)0x0;
        }
        else {
          local_6e8 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getSelfPotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_2a8,3);
        dVar1 = *pdVar6;
        Snapshot::getLongRangePotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_2e0,4);
        local_270 = dVar1 + *pdVar6;
        (**(code **)(*local_6e8 + 0x20))(local_6e8,&local_270);
        break;
      case 0x11:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_708 = (long *)0x0;
        }
        else {
          local_708 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getSelfPotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_318,3);
        (**(code **)(*local_708 + 0x20))(local_708,pdVar6);
        break;
      case 0x12:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff8e8 = pvVar9->accumulator;
        if (in_stack_fffffffffffff8e8 == (BaseAccumulator *)0x0) {
          local_720 = (long *)0x0;
        }
        else {
          local_720 = (long *)__dynamic_cast(in_stack_fffffffffffff8e8,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getLongRangePotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_350,4);
        (**(code **)(*local_720 + 0x20))(local_720,pdVar6);
        break;
      case 0x13:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff8d0 = pvVar9->accumulator;
        if (in_stack_fffffffffffff8d0 == (BaseAccumulator *)0x0) {
          local_738 = (long *)0x0;
        }
        else {
          local_738 = (long *)__dynamic_cast(in_stack_fffffffffffff8d0,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        Snapshot::getLongRangePotentials(in_stack_fffffffffffff6a8);
        pdVar6 = Vector<double,_7U>::operator[](&local_388,5);
        (**(code **)(*local_738 + 0x20))(local_738,pdVar6);
        break;
      case 0x14:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_750 = (Thermo *)0x0;
        }
        else {
          local_750 = (Thermo *)
                      __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                     &Accumulator::typeinfo,0);
        }
        local_390 = Snapshot::getReciprocalPotential(local_10);
        (*(code *)(local_750->info_->randNumGen_).
                  super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)(local_750,&local_390);
        break;
      case 0x15:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_768 = (long *)0x0;
        }
        else {
          local_768 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_398 = Snapshot::getSurfacePotential(local_10);
        (**(code **)(*local_768 + 0x20))(local_768,&local_398);
        break;
      case 0x16:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff888 = pvVar9->accumulator;
        if (in_stack_fffffffffffff888 == (BaseAccumulator *)0x0) {
          local_780 = (long *)0x0;
        }
        else {
          local_780 = (long *)__dynamic_cast(in_stack_fffffffffffff888,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3a0 = Snapshot::getShortRangePotential(local_10);
        (**(code **)(*local_780 + 0x20))(local_780,&local_3a0);
        break;
      case 0x17:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_798 = (long *)0x0;
        }
        else {
          local_798 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3a8 = Snapshot::getBondPotential(local_10);
        (**(code **)(*local_798 + 0x20))(local_798,&local_3a8);
        break;
      case 0x18:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_7b0 = (long *)0x0;
        }
        else {
          local_7b0 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3b0 = Snapshot::getBendPotential(local_10);
        (**(code **)(*local_7b0 + 0x20))(local_7b0,&local_3b0);
        break;
      case 0x19:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_7c8 = (long *)0x0;
        }
        else {
          local_7c8 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3b8 = Snapshot::getTorsionPotential(local_10);
        (**(code **)(*local_7c8 + 0x20))(local_7c8,&local_3b8);
        break;
      case 0x1a:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_7e0 = (long *)0x0;
        }
        else {
          local_7e0 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3c0 = Snapshot::getInversionPotential(local_10);
        (**(code **)(*local_7e0 + 0x20))(local_7e0,&local_3c0);
        break;
      case 0x1b:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_7f8 = (long *)0x0;
        }
        else {
          local_7f8 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3c8 = Snapshot::getRawPotential(local_10);
        (**(code **)(*local_7f8 + 0x20))(local_7f8,&local_3c8);
        break;
      case 0x1c:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_810 = (long *)0x0;
        }
        else {
          local_810 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3d0 = Snapshot::getRestraintPotential(local_10);
        (**(code **)(*local_810 + 0x20))(local_810,&local_3d0);
        break;
      case 0x1d:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_828 = (long *)0x0;
        }
        else {
          local_828 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3d8 = Snapshot::getExcludedPotential(in_stack_fffffffffffff6b0);
        (**(code **)(*local_828 + 0x20))(local_828,&local_3d8);
        break;
      case 0x1e:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator != (BaseAccumulator *)0x0) {
          __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo
                         ,0);
        }
        Thermo::getPressureTensor(in_stack_fffffffffffff9f8);
        MatrixAccumulator::add(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2f5ec9);
        break;
      case 0x1f:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator != (BaseAccumulator *)0x0) {
          __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo
                         ,0);
        }
        Snapshot::getVirialTensor(in_stack_fffffffffffff6a8);
        MatrixAccumulator::add(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2f5fa6);
        break;
      case 0x20:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator != (BaseAccumulator *)0x0) {
          __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo
                         ,0);
        }
        Thermo::getSystemDipole(local_750);
        VectorAccumulator::add
                  ((VectorAccumulator *)local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x21:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator != (BaseAccumulator *)0x0) {
          __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,&MatrixAccumulator::typeinfo
                         ,0);
        }
        Thermo::getSystemQuadrupole((Thermo *)in_stack_fffffffffffffb38);
        MatrixAccumulator::add(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2f6123);
        break;
      case 0x22:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_840 = (long *)0x0;
        }
        else {
          local_840 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3e0 = Thermo::getTaggedAtomPairDistance((Thermo *)in_stack_fffffffffffff768);
        (**(code **)(*local_840 + 0x20))(local_840,&local_3e0);
        break;
      case 0x25:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          in_stack_fffffffffffff9f8 = (Thermo *)0x0;
        }
        else {
          in_stack_fffffffffffff9f8 =
               (Thermo *)
               __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                              &VectorAccumulator::typeinfo,0);
        }
        Thermo::getHeatFlux(in_stack_fffffffffffffae8);
        VectorAccumulator::add
                  ((VectorAccumulator *)local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x26:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_858 = (long *)0x0;
        }
        else {
          local_858 = (long *)__dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_3e8 = Thermo::getElectronicTemperature((Thermo *)in_stack_fffffffffffff6c0);
        (**(code **)(*local_858 + 0x20))(local_858,&local_3e8);
        break;
      case 0x27:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator != (BaseAccumulator *)0x0) {
          __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,&VectorAccumulator::typeinfo
                         ,0);
        }
        Thermo::getCom(in_stack_fffffffffffff758);
        VectorAccumulator::add
                  ((VectorAccumulator *)local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x28:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff780 = pvVar9->accumulator;
        if (in_stack_fffffffffffff780 != (BaseAccumulator *)0x0) {
          __dynamic_cast(in_stack_fffffffffffff780,&BaseAccumulator::typeinfo,
                         &VectorAccumulator::typeinfo,0);
        }
        Thermo::getComVel(in_stack_fffffffffffff758);
        VectorAccumulator::add
                  ((VectorAccumulator *)local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x29:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff768 = pvVar9->accumulator;
        if (in_stack_fffffffffffff768 == (BaseAccumulator *)0x0) {
          in_stack_fffffffffffff758 = (Thermo *)0x0;
        }
        else {
          in_stack_fffffffffffff758 =
               (Thermo *)
               __dynamic_cast(in_stack_fffffffffffff768,&BaseAccumulator::typeinfo,
                              &VectorAccumulator::typeinfo,0);
        }
        in_stack_fffffffffffff760 = in_stack_fffffffffffff758;
        Thermo::getAngularMomentum((Thermo *)in_stack_fffffffffffff888);
        VectorAccumulator::add
                  ((VectorAccumulator *)local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x2a:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        if (pvVar9->accumulator == (BaseAccumulator *)0x0) {
          local_8b8 = (PotVecAccumulator *)0x0;
        }
        else {
          local_8b8 = (PotVecAccumulator *)
                      __dynamic_cast(pvVar9->accumulator,&BaseAccumulator::typeinfo,
                                     &PotVecAccumulator::typeinfo,0);
        }
        Thermo::getSelectionPotentials((Thermo *)in_stack_fffffffffffff6b8);
        PotVecAccumulator::add(local_8b8,(ElementType *)in_stack_fffffffffffff738);
        break;
      case 0x2b:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff738 = pvVar9->accumulator;
        if (in_stack_fffffffffffff738 == (BaseAccumulator *)0x0) {
          local_8d0 = (long *)0x0;
        }
        else {
          local_8d0 = (long *)__dynamic_cast(in_stack_fffffffffffff738,&BaseAccumulator::typeinfo,
                                             &Accumulator::typeinfo,0);
        }
        local_470[0] = Thermo::getNetCharge(in_stack_fffffffffffff6f0);
        (**(code **)(*local_8d0 + 0x20))(local_8d0,local_470);
        break;
      case 0x2c:
        pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
                 operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                             *)(in_RDI + 0x18),(ulong)local_1c);
        in_stack_fffffffffffff720 = (MatrixAccumulator *)pvVar9->accumulator;
        if (in_stack_fffffffffffff720 == (MatrixAccumulator *)0x0) {
          pEVar7 = (ElementType *)0x0;
        }
        else {
          pEVar7 = (ElementType *)
                   __dynamic_cast(in_stack_fffffffffffff720,&BaseAccumulator::typeinfo,
                                  &Accumulator::typeinfo,0);
        }
        in_stack_fffffffffffff718 = pEVar7;
        local_478 = Thermo::getChargeMomentum(in_stack_fffffffffffff6f0);
        (**(code **)((long)(pEVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                           data_[0][0] + 0x20))(pEVar7,&local_478);
        break;
      case 0x2d:
        local_47c = 0;
        Thermo::getCurrentDensity((Thermo *)in_stack_fffffffffffff8e8);
        for (local_49c = 0;
            sVar8 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ::size(&local_498), local_49c < sVar8; local_49c = local_49c + 1) {
          pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ::operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                 *)(in_RDI + 0x18),(ulong)local_1c);
          uVar3 = (ulong)local_47c;
          local_47c = local_47c + 1;
          ppBVar10 = std::
                     vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
                     operator[](&pvVar9->accumulatorArray2d,uVar3);
          if (*ppBVar10 == (value_type)0x0) {
            local_908 = (long *)0x0;
          }
          else {
            local_908 = (long *)__dynamic_cast(*ppBVar10,&BaseAccumulator::typeinfo,
                                               &Accumulator::typeinfo,0);
          }
          pVVar11 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ::operator[](&local_498,(ulong)local_49c)->super_Vector<double,_3U>;
          in_stack_fffffffffffff6f0 = (Thermo *)Vector<double,_3U>::operator[](pVVar11,0);
          (**(code **)(*local_908 + 0x20))(local_908,in_stack_fffffffffffff6f0);
          pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ::operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                 *)(in_RDI + 0x18),(ulong)local_1c);
          uVar3 = (ulong)local_47c;
          local_47c = local_47c + 1;
          ppBVar10 = std::
                     vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
                     operator[](&pvVar9->accumulatorArray2d,uVar3);
          if (*ppBVar10 == (value_type)0x0) {
            local_928 = (long *)0x0;
          }
          else {
            local_928 = (long *)__dynamic_cast(*ppBVar10,&BaseAccumulator::typeinfo,
                                               &Accumulator::typeinfo,0);
          }
          pVVar11 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ::operator[](&local_498,(ulong)local_49c)->super_Vector<double,_3U>;
          in_stack_fffffffffffff6d0 = (Thermo *)Vector<double,_3U>::operator[](pVVar11,1);
          (**(code **)(*local_928 + 0x20))(local_928,in_stack_fffffffffffff6d0);
          pvVar9 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                   ::operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                 *)(in_RDI + 0x18),(ulong)local_1c);
          uVar3 = (ulong)local_47c;
          local_47c = local_47c + 1;
          ppBVar10 = std::
                     vector<OpenMD::BaseAccumulator_*,_std::allocator<OpenMD::BaseAccumulator_*>_>::
                     operator[](&pvVar9->accumulatorArray2d,uVar3);
          in_stack_fffffffffffff6c0 = *ppBVar10;
          if (in_stack_fffffffffffff6c0 == (value_type)0x0) {
            in_stack_fffffffffffff6a8 = (Snapshot *)0x0;
          }
          else {
            in_stack_fffffffffffff6a8 =
                 (Snapshot *)
                 __dynamic_cast(in_stack_fffffffffffff6c0,&BaseAccumulator::typeinfo,
                                &Accumulator::typeinfo,0);
          }
          in_stack_fffffffffffff6b8 = in_stack_fffffffffffff6a8;
          pVVar11 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ::operator[](&local_498,(ulong)local_49c)->super_Vector<double,_3U>;
          in_stack_fffffffffffff6b0 = (Snapshot *)Vector<double,_3U>::operator[](pVVar11,2);
          (**(code **)((long)((in_stack_fffffffffffff6a8->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1) + 8))
                    (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6b0);
        }
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffff6c0);
      }
    }
  }
  return;
}

Assistant:

void Stats::collectStats() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Thermo thermo(info_);

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i]) {
        switch (i) {
        case TIME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTime());
          break;
        case KINETIC_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getKinetic());
          break;
        case POTENTIAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPotential());
          break;
        case TOTAL_ENERGY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTotalEnergy());
          break;
        case TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTemperature());
          break;
        case PRESSURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getPressure());
          break;
        case VOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getVolume());
          break;
        case CONSERVED_QUANTITY:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getConservedQuantity());
          break;
        case PRESSURE_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getPressureTensor());
          break;
          // virial Tensor
        case VIRIAL_TENSOR:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(snap->getVirialTensor());
          break;

        case SYSTEM_DIPOLE:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemDipole());
          break;
        case SYSTEM_QUADRUPOLE:
          dynamic_cast<MatrixAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSystemQuadrupole());
          break;
        case HEATFLUX:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getHeatFlux());
          break;
        case HULLVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getHullVolume());
          break;
        case GYRVOLUME:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getGyrationalVolume());
          break;
        case TRANSLATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTranslationalKinetic());
          break;
        case ROTATIONAL_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getRotationalKinetic());
          break;
        case ELECTRONIC_KINETIC:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicKinetic());
          break;
        case LONG_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotential());
          break;
        case VANDERWAALS_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[VANDERWAALS_FAMILY]);
          break;
        case ELECTROSTATIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[ELECTROSTATIC_FAMILY] +
                    snap->getSelfPotentials()[ELECTROSTATIC_FAMILY]);
          break;
        case METALLIC_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY] +
                    snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case METALLIC_EMBEDDING:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSelfPotentials()[METALLIC_EMBEDDING_FAMILY]);
          break;
        case METALLIC_PAIR:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[METALLIC_PAIR_FAMILY]);
          break;
        case HYDROGENBONDING_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getLongRangePotentials()[HYDROGENBONDING_FAMILY]);
          break;
        case RECIPROCAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getReciprocalPotential());
          break;
        case SURFACE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getSurfacePotential());
          break;
        case SHORT_RANGE_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getShortRangePotential());
          break;
        case BOND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBondPotential());
          break;
        case BEND_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getBendPotential());
          break;
        case DIHEDRAL_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getTorsionPotential());
          break;
        case INVERSION_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getInversionPotential());
          break;
        case RAW_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRawPotential());
          break;
        case RESTRAINT_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getRestraintPotential());
          break;
        case EXCLUDED_POTENTIAL:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(snap->getExcludedPotential());
          break;
        case TAGGED_PAIR_DISTANCE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getTaggedAtomPairDistance());
          break;
        case ELECTRONIC_TEMPERATURE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getElectronicTemperature());
          break;
        case COM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getCom());
          break;
        case COM_VELOCITY:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getComVel());
          break;
        case ANGULAR_MOMENTUM:
          dynamic_cast<VectorAccumulator*>(data_[i].accumulator)
              ->add(thermo.getAngularMomentum());
          break;
        case POTENTIAL_SELECTION:
          dynamic_cast<PotVecAccumulator*>(data_[i].accumulator)
              ->add(thermo.getSelectionPotentials());
          break;
        case NET_CHARGE:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getNetCharge());
          break;
        case CHARGE_MOMENTUM:
          dynamic_cast<Accumulator*>(data_[i].accumulator)
              ->add(thermo.getChargeMomentum());
          break;
        case CURRENT_DENSITY:
          unsigned int k           = 0;
          std::vector<Vector3d> Jc = thermo.getCurrentDensity();
          for (unsigned int j = 0; j < Jc.size(); ++j) {
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][0]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][1]);
            dynamic_cast<Accumulator*>(data_[i].accumulatorArray2d[k++])
                ->add(Jc[j][2]);
          }
          break;

          /*
            case SHADOWH:
            dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getShadowHamiltionian());
            break; case HELFANDMOMENT: dynamic_cast<Accumulator
            *>(data_[i].accumulator)->add(thermo.getHelfandMoment()); break;
          */
        }
      }
    }
  }